

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O2

int x86SUB(uchar *stream,x86Size size,x86Reg index,int multiplier,x86Reg base,int shift,int num)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  uchar *puVar4;
  
  if (1 < size - sDWORD) {
    __assert_fail("size == sDWORD || size == sQWORD",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Translator_X86.cpp"
                  ,0x538,"int x86SUB(unsigned char *, x86Size, x86Reg, int, x86Reg, int, int)");
  }
  bVar1 = 8 < (int)base | (8 < (int)index) * '\x02' | (size == sQWORD) << 3;
  if (bVar1 != 0) {
    *stream = bVar1 | 0x40;
  }
  puVar4 = stream + (bVar1 != 0);
  if ((char)(uchar)num == num) {
    *puVar4 = 0x83;
    uVar2 = encodeAddress(puVar4 + 1,index,multiplier,base,shift,5);
    iVar3 = (int)(puVar4 + uVar2) + 2;
    (puVar4 + uVar2)[1] = (uchar)num;
  }
  else {
    *puVar4 = 0x81;
    uVar2 = encodeAddress(puVar4 + 1,index,multiplier,base,shift,5);
    iVar3 = (int)(puVar4 + uVar2) + 5;
    *(int *)(puVar4 + uVar2 + 1) = num;
  }
  return iVar3 - (int)stream;
}

Assistant:

int x86SUB(unsigned char *stream, x86Size size, x86Reg index, int multiplier, x86Reg base, int shift, int num)
{
	unsigned char *start = stream;

	assert(size == sDWORD || size == sQWORD);

	stream += encodeRex(stream, size == sQWORD, rNONE, index, base);

	if((char)(num) == num)
	{
		*stream++ = 0x83;
		stream += encodeAddress(stream, index, multiplier, base, shift, 5);
		stream += encodeImmByte(stream, (char)num);

		return int(stream - start);
	}

	*stream++ = 0x81;
	stream += encodeAddress(stream, index, multiplier, base, shift, 5);
	stream += encodeImmDword(stream, num);

	return int(stream - start);
}